

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall
pbrt::TriangleMesh::TriangleMesh
          (TriangleMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *s,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv,
          vector<int,_std::allocator<int>_> faceIndices)

{
  undefined8 uVar1;
  pointer pPVar2;
  long lVar3;
  Tuple3<pbrt::Normal3,_float> *pTVar4;
  Vector3<float> *pVVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *buf;
  bool bVar7;
  ulong uVar8;
  int *piVar9;
  Point3<float> *pPVar10;
  Point2<float> *pPVar11;
  Normal3<float> *pNVar12;
  Vector3<float> *pVVar13;
  int iVar14;
  char *args_1;
  Point3f *pt;
  pointer p_00;
  Tuple3<pbrt::Normal3,_float> *this_00;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  long in_FS_OFFSET;
  undefined1 auVar15 [32];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  Point3<float> PVar18;
  Normal3<float> NVar19;
  Vector3<float> VVar20;
  int vb;
  size_type va;
  vector<int,_std::allocator<int>_> *local_40;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *local_38;
  
  uVar8 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  va = uVar8 % 3;
  iVar14 = (int)(uVar8 / 3);
  this->nTriangles = iVar14;
  this->nVertices =
       (int)(((long)(p->
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(p->
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc);
  auVar15 = ZEXT1632(ZEXT816(0) << 0x40);
  this->vertexIndices = (int *)auVar15._0_8_;
  this->p = (Point3f *)auVar15._8_8_;
  this->n = (Normal3f *)auVar15._16_8_;
  this->s = (Vector3f *)auVar15._24_8_;
  this->n = (Normal3f *)auVar15._0_8_;
  this->s = (Vector3f *)auVar15._8_8_;
  this->uv = (Point2f *)auVar15._16_8_;
  this->faceIndices = (int *)auVar15._24_8_;
  vb = 0;
  local_38 = s;
  if (va != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x1c,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [21])"(indices.size() % 3)",(char (*) [2])0x28b5108,
               (char (*) [21])"(indices.size() % 3)",&va,(char (*) [2])0x28b5108,&vb);
  }
  *(long *)(in_FS_OFFSET + -0x4d8) = *(long *)(in_FS_OFFSET + -0x4d8) + 1;
  *(long *)(in_FS_OFFSET + -0x4c8) = *(long *)(in_FS_OFFSET + -0x4c8) + 0x40;
  *(long *)(in_FS_OFFSET + -0x4d0) = *(long *)(in_FS_OFFSET + -0x4d0) + (long)iVar14;
  auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
  local_40 = indices;
  piVar9 = BufferCache<int>::LookupOrAdd(intBufferCache,indices);
  this->vertexIndices = piVar9;
  pPVar2 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start; auVar17 = auVar16._8_56_, p_00 != pPVar2;
      p_00 = p_00 + 1) {
    PVar18 = Transform::operator()(renderFromObject,p_00);
    auVar16._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar17;
    uVar1 = vmovlps_avx(auVar16._0_16_);
    (p_00->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar1;
    (p_00->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
    (p_00->super_Tuple3<pbrt::Point3,_float>).z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  }
  pPVar10 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd(point3BufferCache,p);
  this->p = pPVar10;
  this->reverseOrientation = reverseOrientation;
  bVar7 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar7;
  lVar3 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float> !=
      lVar3) {
    vb = this->nVertices;
    va = lVar3 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->
                           super_Tuple3<pbrt::Normal3,_float> >> 3;
    if (va != (long)vb) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x2d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [10])"uv.size()",(char (*) [10])"nVertices",&vb,
                 (char (*) [10])"uv.size()",&va);
    }
    pPVar11 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                        (point2BufferCache,
                         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    this->uv = pPVar11;
  }
  this_00 = *(Tuple3<pbrt::Normal3,_float> **)
             &(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>;
  pTVar4 = *(Tuple3<pbrt::Normal3,_float> **)
            &((n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>).z;
  if (this_00 != pTVar4) {
    vb = this->nVertices;
    va = ((long)pTVar4 - (long)this_00) / 0xc;
    if (va != (long)vb) {
      args_1 = "n.size()";
      iVar14 = 0x31;
      goto LAB_00315492;
    }
    for (; auVar17 = auVar16._8_56_, this_00 != pTVar4; this_00 = this_00 + 1) {
      NVar19 = Transform::operator()(renderFromObject,(Normal3<float> *)this_00);
      auVar16._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar16._8_56_ = auVar17;
      uVar1 = vmovlps_avx(auVar16._0_16_);
      this_00->x = (float)(int)uVar1;
      this_00->y = (float)(int)((ulong)uVar1 >> 0x20);
      this_00->z = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
      if (reverseOrientation) {
        NVar19 = Tuple3<pbrt::Normal3,_float>::operator-(this_00);
        auVar16._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar16._8_56_ = auVar17;
        uVar1 = vmovlps_avx(auVar16._0_16_);
        this_00->x = (float)(int)uVar1;
        this_00->y = (float)(int)((ulong)uVar1 >> 0x20);
        this_00->z = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
      }
    }
    pNVar12 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        (normal3BufferCache,
                         (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    this->n = pNVar12;
  }
  buf = local_38;
  pVVar13 = (local_38->
            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (local_38->
           super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pVVar13 != pVVar5) {
    vb = this->nVertices;
    va = ((long)pVVar5 - (long)pVVar13) / 0xc;
    if (va != (long)vb) {
      args_1 = "s.size()";
      iVar14 = 0x3a;
LAB_00315492:
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,iVar14,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [9])args_1,(char (*) [10])"nVertices",&vb,(char (*) [9])args_1,&va);
    }
    for (; auVar17 = auVar16._8_56_, pVVar13 != pVVar5; pVVar13 = pVVar13 + 1) {
      VVar20 = Transform::operator()(renderFromObject,pVVar13);
      auVar16._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar17;
      uVar1 = vmovlps_avx(auVar16._0_16_);
      (pVVar13->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
      (pVVar13->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
      (pVVar13->super_Tuple3<pbrt::Vector3,_float>).z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    pVVar13 = BufferCache<pbrt::Vector3<float>_>::LookupOrAdd(vector3BufferCache,buf);
    this->s = pVVar13;
  }
  pvVar6 = local_40;
  lVar3 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->
                super_Tuple3<pbrt::Normal3,_float> != lVar3) {
    vb = this->nTriangles;
    va = lVar3 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super_Tuple3<pbrt::Normal3,_float> >> 2;
    if (va != (long)vb) {
      LogFatal<char_const(&)[11],char_const(&)[19],char_const(&)[11],int&,char_const(&)[19],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x41,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"nTriangles",
                 (char (*) [19])"faceIndices.size()",(char (*) [11])"nTriangles",&vb,
                 (char (*) [19])"faceIndices.size()",&va);
    }
    piVar9 = BufferCache<int>::LookupOrAdd
                       (intBufferCache,
                        (vector<int,_std::allocator<int>_> *)
                        n.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this->faceIndices = piVar9;
  }
  va = ((long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
       (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start) / 0xc;
  vb = 0x7fffffff;
  if ((va & 0xffffffff80000000) == 0) {
    vb = 0x7fffffff;
    va = (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2;
    if ((va & 0xffffffff80000000) == 0) {
      return;
    }
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x4b,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [15])"indices.size()",
               (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [15])"indices.size()",&va,
               (char (*) [32])"std::numeric_limits<int>::max()",&vb);
  }
  LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
             ,0x47,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [9])"p.size()",
             (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [9])"p.size()",&va,
             (char (*) [32])"std::numeric_limits<int>::max()",&vb);
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices);

    // Transform mesh vertices to render space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}